

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcess.cpp
# Opt level: O0

void ac::core::detail::yuva2rgba<float,float>
               (Image *srcy,Image *srcu,Image *srcv,Image *srca,Image *dst)

{
  Image *in_stack_00000078;
  Image *in_stack_00000080;
  Image *in_stack_00000088;
  Image *in_stack_00000090;
  Image *in_stack_00000098;
  anon_class_1_0_00000001 *in_stack_000000a0;
  
  filter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TianZerL[P]Anime4KCPP_core_src_ImageProcess_cpp:316:16),_const_ac::core::Image,_const_ac::core::Image,_const_ac::core::Image,_const_ac::core::Image,_ac::core::Image,_true>
            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             in_stack_00000080,in_stack_00000078);
  return;
}

Assistant:

inline void yuva2rgba(const Image& srcy, const Image& srcu, const Image& srcv, const Image& srca, Image& dst)
    {
        filter([](const int /*i*/, const int /*j*/, const void* const yptr, const void* const uptr, const void* const vptr, const void* const aptr, void* const dptr) {
            auto yin = static_cast<const IN*>(yptr);
            auto uin = static_cast<const IN*>(uptr);
            auto vin = static_cast<const IN*>(vptr);
            auto ain = static_cast<const IN*>(aptr);
            auto out = static_cast<OUT*>(dptr);

            float y = toFloat(*yin);
            float u = toFloat(*uin) - 0.5f;
            float v = toFloat(*vin) - 0.5f;

            float r = y + 1.403f * v;
            float g = y - 0.344f * u - 0.714f * v;
            float b = y + 1.773f * u;

            out[0] = fromFloat<OUT>(r);
            out[1] = fromFloat<OUT>(g);
            out[2] = fromFloat<OUT>(b);
            if constexpr (std::is_same_v<IN, OUT>) out[3] = *ain;
            else out[3] = fromFloat<OUT>(toFloat(*ain));
        }, srcy, srcu, srcv, srca, dst);
    }